

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::FindEntryWithKey<int>
          (SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int *key)

{
  type tVar1;
  bool bVar2;
  int **ppiVar3;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> **ppVVar4;
  type_conflict local_44;
  int local_40;
  TBKey k;
  int last;
  int i;
  EntryType *localEntries;
  uint targetBucket;
  hash_t hashCode;
  int *localBuckets;
  int *key_local;
  SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  localBuckets = key;
  key_local = (int *)this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  _targetBucket = *ppiVar3;
  if (_targetBucket != (int *)0x0) {
    localEntries._4_4_ = GetHashCodeWithKey<int>(localBuckets);
    localEntries._0_4_ = GetBucket(this,localEntries._4_4_);
    ppVVar4 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                        ((WriteBarrierPtr *)&this->entries);
    _last = *ppVVar4;
    k = _targetBucket[(uint)localEntries];
    local_40 = -1;
    while (-1 < k) {
      local_44 = GetKey<false>(this,k);
      tVar1 = RemoveIfCollected<false>(this,local_44,&k,local_40,(uint)localEntries);
      if (!tVar1) {
        bVar2 = DefaultComparer<int>::Equals(&local_44,localBuckets);
        if (bVar2) {
          return k;
        }
        local_40 = k;
        k = _last[k].super_ValueEntryData<int>.next;
      }
    }
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key)
        {
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }
                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        return i;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }
            return -1;
        }